

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O1

size_t __thiscall
CCharmapToLocalSB::map_utf8
          (CCharmapToLocalSB *this,char *dest,size_t dest_len,utf8_ptr src,size_t src_byte_len,
          size_t *src_bytes_used)

{
  uint *puVar1;
  uchar *puVar2;
  bool bVar3;
  wchar_t wVar4;
  uint uVar5;
  utf8_ptr p;
  ulong __n;
  size_t sVar6;
  ulong local_48;
  
  sVar6 = 0;
  p.p_ = src.p_;
  if (0 < (long)src_byte_len) {
    local_48 = dest_len;
    do {
      wVar4 = utf8_ptr::s_getch(p.p_);
      puVar1 = (this->super_CCharmapToLocal).map_[(uint)wVar4 >> 8 & 0xff];
      if (puVar1 == (uint *)0x0) {
        uVar5 = 0;
      }
      else {
        uVar5 = puVar1[(uint)(wVar4 & 0xff)];
      }
      puVar2 = (this->super_CCharmapToLocal).xlat_array_;
      __n = (ulong)puVar2[uVar5];
      if (dest == (char *)0x0) {
        dest = (char *)0x0;
LAB_00226a99:
        sVar6 = sVar6 + __n;
        bVar3 = true;
      }
      else {
        if (__n <= local_48) {
          memcpy(dest,puVar2 + (ulong)uVar5 + 1,__n);
          dest = dest + __n;
          local_48 = local_48 - __n;
          goto LAB_00226a99;
        }
        bVar3 = false;
      }
    } while ((bVar3) &&
            (p.p_ = p.p_ + (ulong)((((byte)*p.p_ >> 5 & 1) != 0) + 1 & (uint)((byte)*p.p_ >> 7) * 3)
                           + 1, p.p_ < src.p_ + src_byte_len));
  }
  if (src_bytes_used != (size_t *)0x0) {
    *src_bytes_used = (long)p.p_ - (long)src.p_;
  }
  return sVar6;
}

Assistant:

size_t CCharmapToLocalSB::map_utf8(char *dest, size_t dest_len,
                                   utf8_ptr src, size_t src_byte_len,
                                   size_t *src_bytes_used) const
{
    /* remember where we started */
    utf8_ptr src_start = src;

    /* compute where the source buffer ends */
    char *srcend = src.getptr() + src_byte_len;

    /* copy characters until we reach the end of the source string */
    size_t cur_total;
    for (cur_total = 0 ; src.getptr() < srcend ; src.inc())
    {
        const unsigned char *mapping;
        size_t map_len;
        
        /* get the mapping for this character */
        mapping = get_xlation(src.getch(), &map_len);

        /* 
         *   if we have room, add it; otherwise, zero the output length
         *   remaining so we don't try to add anything more 
         */
        if (dest == 0)
        {
            /* we're just counting */
        }
        else if (map_len <= dest_len)
        {
            /* add the sequence */
            memcpy(dest, mapping, map_len);

            /* adjust the output pointer and length remaining */
            dest += map_len;
            dest_len -= map_len;
        }
        else
        {
            /* it doesn't fit - stop now */
            break;
        }

        /* count the length in the total */
        cur_total += map_len;
    }

    /* if the caller wants to know how much space we used, tell them */
    if (src_bytes_used != 0)
        *src_bytes_used = src.getptr() - src_start.getptr();

    /* return the total length of the result */
    return cur_total;
}